

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

int __thiscall Fl_Data_Type::open(Fl_Data_Type *this,char *__file,int __oflag,...)

{
  Fl_Menu_Item *pFVar1;
  bool bVar2;
  Fl_Window *pFVar3;
  bool bVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Fl_Button *pFVar10;
  char *pcVar11;
  Fl_Data_Type *__s1;
  Fl_Choice **ppFVar12;
  Fl_Data_Type *pFVar13;
  Fl_Data_Type *pFVar14;
  char *pcVar15;
  Fl_Choice **ppFVar16;
  Fl_Data_Type *pFVar17;
  char *local_40;
  
  if (data_panel == (Fl_Double_Window *)0x0) {
    make_data_panel();
  }
  Fl_Input_::static_value
            (&data_input->super_Fl_Input_,(this->super_Fl_Decl_Type).super_Fl_Type.name_);
  pFVar14 = this;
  do {
    pFVar14 = (Fl_Data_Type *)(pFVar14->super_Fl_Decl_Type).super_Fl_Type.parent;
    if (pFVar14 == (Fl_Data_Type *)0x0) goto LAB_0017aa2f;
    iVar7 = (*(pFVar14->super_Fl_Decl_Type).super_Fl_Type._vptr_Fl_Type[0x26])(pFVar14);
  } while (iVar7 == 0);
  if (pFVar14 == (Fl_Data_Type *)0x0) {
LAB_0017aa2f:
    ppFVar12 = &data_choice;
    Fl_Choice::value(data_choice,
                     ((byte)(this->super_Fl_Decl_Type).public_ & 1) +
                     ((byte)(this->super_Fl_Decl_Type).static_ & 1) * 2);
    ppFVar16 = &data_class_choice;
  }
  else {
    ppFVar12 = &data_class_choice;
    Fl_Choice::value(data_class_choice,(int)(this->super_Fl_Decl_Type).public_);
    ppFVar16 = &data_choice;
  }
  (*((*ppFVar12)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
  (*((*ppFVar16)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  pcVar15 = this->filename_;
  if (pcVar15 == (char *)0x0) {
    pcVar15 = "";
  }
  Fl_Input_::value(&data_filename->super_Fl_Input_,pcVar15);
  pcVar15 = (this->super_Fl_Decl_Type).super_Fl_Type.comment_;
  if (pcVar15 == (char *)0x0) {
    pcVar15 = "";
  }
  Fl_Text_Buffer::text((data_comment_input->super_Fl_Text_Display).mBuffer,pcVar15);
  pcVar15 = (char *)data_panel;
  (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  local_40 = (char *)0x0;
  do {
    if (local_40 != (char *)0x0) {
      pcVar15 = "%s";
      fl_alert("%s");
    }
    do {
      pFVar10 = (Fl_Button *)Fl::readqueue();
      if (pFVar10 == data_panel_cancel) {
        iVar7 = 6;
      }
      else if (pFVar10 == &data_panel_ok->super_Fl_Button) {
        iVar7 = 4;
      }
      else if (pFVar10 == data_filebrowser) {
        goto_source_dir();
        iVar7 = 0;
        pcVar15 = "Load Binary Data";
        pcVar11 = fl_file_chooser("Load Binary Data",(char *)0x0,
                                  (data_filename->super_Fl_Input_).value_,1);
        leave_source_dir();
        if (pcVar11 != (char *)0x0) {
          iVar8 = strcmp(pcVar11,(data_filename->super_Fl_Input_).value_);
          if (iVar8 != 0) {
            set_modflag(1);
          }
          pcVar15 = (char *)data_filename;
          Fl_Input_::value(&data_filename->super_Fl_Input_,pcVar11);
        }
      }
      else {
        iVar7 = 0;
        if (pFVar10 == (Fl_Button *)0x0) {
          Fl::wait(pcVar15);
          iVar7 = 0;
        }
      }
    } while (iVar7 == 0);
    if (iVar7 == 6) break;
    __s1 = (Fl_Data_Type *)strdup((data_input->super_Fl_Input_).value_);
    pFVar14 = (Fl_Data_Type *)((long)&__s1[-1].filename_ + 7);
    pFVar13 = __s1;
    do {
      pFVar13 = (Fl_Data_Type *)
                ((long)&(((Fl_Window *)&pFVar13->super_Fl_Decl_Type)->super_Fl_Group).
                        super_Fl_Widget._vptr_Fl_Widget + 1);
      bVar5 = *(byte *)((long)&(((Fl_Window *)&pFVar14->super_Fl_Decl_Type)->super_Fl_Group).
                               super_Fl_Widget._vptr_Fl_Widget + 1);
      uVar9 = (uint)bVar5;
      pFVar14 = (Fl_Data_Type *)
                ((long)&(((Fl_Window *)&pFVar14->super_Fl_Decl_Type)->super_Fl_Group).
                        super_Fl_Widget._vptr_Fl_Widget + 1);
      iVar7 = isspace(uVar9);
    } while (iVar7 != 0);
    iVar7 = isalpha((uint)bVar5);
    if (((iVar7 == 0) && (uVar9 != 0x3a)) && (uVar9 != 0x5f)) {
LAB_0017acb4:
      local_40 = "variable name must be a C identifier";
      bVar4 = true;
LAB_0017aeb1:
      bVar2 = bVar4;
      pcVar15 = (char *)__s1;
      free(pcVar15);
    }
    else {
      while( true ) {
        bVar5 = *(byte *)&(((Fl_Window *)&pFVar13->super_Fl_Decl_Type)->super_Fl_Group).
                          super_Fl_Widget._vptr_Fl_Widget;
        iVar7 = isalnum((uint)bVar5);
        if (((iVar7 == 0) && (bVar5 != 0x3a)) && (bVar5 != 0x5f)) break;
        pFVar13 = (Fl_Data_Type *)
                  ((long)&(((Fl_Window *)&pFVar13->super_Fl_Decl_Type)->super_Fl_Group).
                          super_Fl_Widget._vptr_Fl_Widget + 1);
      }
      bVar5 = *(byte *)&(((Fl_Window *)&pFVar13->super_Fl_Decl_Type)->super_Fl_Group).
                        super_Fl_Widget._vptr_Fl_Widget;
      pFVar17 = pFVar13;
      while (bVar5 != 0) {
        iVar7 = isspace((uint)bVar5);
        if (iVar7 == 0) goto LAB_0017acb4;
        pFVar3 = (Fl_Window *)&pFVar17->super_Fl_Decl_Type;
        pFVar17 = (Fl_Data_Type *)
                  ((long)&(((Fl_Window *)&pFVar17->super_Fl_Decl_Type)->super_Fl_Group).
                          super_Fl_Widget._vptr_Fl_Widget + 1);
        bVar5 = *(byte *)((long)&(pFVar3->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget + 1);
      }
      if (pFVar14 == pFVar17) goto LAB_0017acb4;
      *(undefined1 *)
       &(((Fl_Window *)&pFVar13->super_Fl_Decl_Type)->super_Fl_Group).super_Fl_Widget.
        _vptr_Fl_Widget = 0;
      Fl_Type::name((Fl_Type *)this,(char *)pFVar14);
      free(__s1);
      pFVar14 = this;
      do {
        pFVar14 = (Fl_Data_Type *)(pFVar14->super_Fl_Decl_Type).super_Fl_Type.parent;
        if (pFVar14 == (Fl_Data_Type *)0x0) goto LAB_0017acce;
        iVar7 = (*(pFVar14->super_Fl_Decl_Type).super_Fl_Type._vptr_Fl_Type[0x26])(pFVar14);
      } while (iVar7 == 0);
      if (pFVar14 == (Fl_Data_Type *)0x0) {
LAB_0017acce:
        pFVar1 = (data_choice->super_Fl_Menu_).value_;
        if (pFVar1 == (Fl_Menu_Item *)0x0) {
          uVar9 = 1;
        }
        else {
          uVar9 = (uint)((int)pFVar1 - *(int *)&(data_choice->super_Fl_Menu_).menu_) >> 3 & 1;
        }
        if (uVar9 != (int)(this->super_Fl_Decl_Type).public_) {
          set_modflag(1);
          pFVar1 = (data_choice->super_Fl_Menu_).value_;
          if (pFVar1 == (Fl_Menu_Item *)0x0) {
            bVar5 = 1;
          }
          else {
            bVar5 = (byte)((char)pFVar1 - (char)*(undefined4 *)&(data_choice->super_Fl_Menu_).menu_)
                    >> 3 & 1;
          }
          (this->super_Fl_Decl_Type).public_ = bVar5;
        }
        pFVar1 = (data_choice->super_Fl_Menu_).value_;
        if (pFVar1 == (Fl_Menu_Item *)0x0) {
          uVar9 = 1;
        }
        else {
          uVar9 = -((uint)((int)pFVar1 - *(int *)&(data_choice->super_Fl_Menu_).menu_) >> 3) >> 1 &
                  1;
        }
        if (uVar9 != (int)(this->super_Fl_Decl_Type).static_) {
          set_modflag(1);
          pFVar1 = (data_choice->super_Fl_Menu_).value_;
          if (pFVar1 == (Fl_Menu_Item *)0x0) {
            bVar5 = 1;
          }
          else {
            bVar5 = (byte)-((byte)((char)pFVar1 -
                                  (char)*(undefined4 *)&(data_choice->super_Fl_Menu_).menu_) >> 3)
                    >> 1 & 1;
          }
          (this->super_Fl_Decl_Type).static_ = bVar5;
        }
      }
      else {
        pFVar1 = (data_class_choice->super_Fl_Menu_).value_;
        if (pFVar1 == (Fl_Menu_Item *)0x0) {
          iVar7 = -1;
        }
        else {
          iVar7 = (int)((ulong)((long)pFVar1 - (long)(data_class_choice->super_Fl_Menu_).menu_) >> 3
                       ) * -0x49249249;
        }
        if (iVar7 != (this->super_Fl_Decl_Type).public_) {
          set_modflag(1);
          pFVar1 = (data_class_choice->super_Fl_Menu_).value_;
          if (pFVar1 == (Fl_Menu_Item *)0x0) {
            cVar6 = -1;
          }
          else {
            cVar6 = (char)((uint)((int)pFVar1 - *(int *)&(data_class_choice->super_Fl_Menu_).menu_)
                          >> 3) * -0x49;
          }
          (this->super_Fl_Decl_Type).public_ = cVar6;
        }
      }
      pcVar15 = (data_filename->super_Fl_Input_).value_;
      pcVar11 = this->filename_;
      if (pcVar11 == (char *)0x0) {
LAB_0017ae05:
        if (*pcVar15 != '\0') {
LAB_0017ae0c:
          set_modflag(1);
        }
      }
      else {
        iVar7 = strcmp(pcVar11,pcVar15);
        if (iVar7 != 0) goto LAB_0017ae0c;
        if (pcVar11 == (char *)0x0) goto LAB_0017ae05;
      }
      if (this->filename_ != (char *)0x0) {
        free(this->filename_);
        this->filename_ = (char *)0x0;
      }
      if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
        pcVar15 = strdup(pcVar15);
        this->filename_ = pcVar15;
      }
      __s1 = (Fl_Data_Type *)
             Fl_Text_Buffer::text((data_comment_input->super_Fl_Text_Display).mBuffer);
      if ((__s1 == (Fl_Data_Type *)0x0) ||
         (*(char *)&(((Fl_Window *)&__s1->super_Fl_Decl_Type)->super_Fl_Group).super_Fl_Widget.
                    _vptr_Fl_Widget == '\0')) {
        if ((this->super_Fl_Decl_Type).super_Fl_Type.comment_ != (char *)0x0) {
          redraw_browser();
        }
        pFVar14 = (Fl_Data_Type *)0x0;
      }
      else {
        pcVar15 = (this->super_Fl_Decl_Type).super_Fl_Type.comment_;
        pFVar14 = __s1;
        if ((pcVar15 == (char *)0x0) || (iVar7 = strcmp((char *)__s1,pcVar15), iVar7 != 0)) {
          redraw_browser();
        }
      }
      pcVar15 = (char *)this;
      Fl_Type::comment((Fl_Type *)this,(char *)pFVar14);
      bVar2 = false;
      bVar4 = false;
      if (__s1 != (Fl_Data_Type *)0x0) goto LAB_0017aeb1;
    }
  } while (bVar2);
  iVar7 = (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar7;
}

Assistant:

void Fl_Data_Type::open() {
  if (!data_panel) make_data_panel();
  data_input->static_value(name());
  if (is_in_class()) {
    data_class_choice->value(public_);
    data_class_choice->show();
    data_choice->hide();
  } else {
    data_choice->value((public_&1)|((static_&1)<<1));
    data_choice->show();
    data_class_choice->hide();
  }
  data_filename->value(filename_?filename_:"");
  const char *c = comment();
  data_comment_input->buffer()->text(c?c:"");
  data_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == data_panel_cancel) goto BREAK2;
      else if (w == data_panel_ok) break;
      else if (w == data_filebrowser) {
        goto_source_dir();
        const char *fn = fl_file_chooser("Load Binary Data", 0L, data_filename->value(), 1);
        leave_source_dir();
        if (fn) {
          if (strcmp(fn, data_filename->value()))
            set_modflag(1); 
          data_filename->value(fn);
        }
      }
      else if (!w) Fl::wait();
    }
    // store the variable name:
    const char*c = data_input->value();
    char *s = strdup(c), *p = s, *q, *n;
    for (;;++p) {
      if (!isspace((unsigned char)(*p))) break;
    }
    n = p;
    if ( (!isalpha((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) goto OOPS;
    ++p;
    for (;;++p) {
      if ( (!isalnum((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) break;
    }
    q = p;
    for (;;++q) {
      if (!*q) break;
      if (!isspace((unsigned char)(*q))) goto OOPS;
    }		
    if (n==q) {
    OOPS: message = "variable name must be a C identifier";
      free((void*)s);
      continue;
    }
    *p = 0;
    name(n);
    free(s);
    // store flags
    if (is_in_class()) {
      if (public_!=data_class_choice->value()) {
        set_modflag(1);
        public_ = data_class_choice->value();
      }
    } else {
      if (public_!=(data_choice->value()&1)) {
        set_modflag(1);
        public_ = (data_choice->value()&1);
      }
      if (static_!=((data_choice->value()>>1)&1)) {
        set_modflag(1);
        static_ = ((data_choice->value()>>1)&1);
      }
    }
    // store the filename
    c = data_filename->value();
    if (filename_ && strcmp(filename_, data_filename->value()))
      set_modflag(1); 
    else if (!filename_ && *c)
      set_modflag(1);
    if (filename_) { free((void*)filename_); filename_ = 0L; }
    if (c && *c) filename_ = strdup(c);
    // store the comment
    c = data_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    break;
  }
BREAK2:
  data_panel->hide();
}